

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
upb::generator::(anonymous_namespace)::ToCIdent_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view str)

{
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  pStack_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_68;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&pStack_88,(char (*) [2])0x139503,(char (*) [2])0x12a474);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_68,(char (*) [2])0x131af6,(char (*) [2])0x12a474);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_48,(char (*) [2])"-",(char (*) [2])0x12a474);
  absl::lts_20240722::StrReplaceAll_abi_cxx11_(__return_storage_ptr__,this,str._M_len,&pStack_88,3);
  return __return_storage_ptr__;
}

Assistant:

std::string ToCIdent(absl::string_view str) {
  return absl::StrReplaceAll(str, {{".", "_"}, {"/", "_"}, {"-", "_"}});
}